

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

error_code llvm::sys::fs::copy_file_internal(int ReadFD,int WriteFD)

{
  void *__buf;
  ulong uVar1;
  ssize_t sVar2;
  error_category *peVar3;
  uint *puVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  error_code eVar8;
  
  __buf = operator_new__(0x1000);
  while( true ) {
    uVar1 = read(ReadFD,__buf,0x1000);
    iVar7 = (int)uVar1;
    uVar1 = uVar1 & 0xffffffff;
    iVar6 = iVar7;
    if (iVar7 < 1) break;
    while (iVar6 = (int)uVar1, iVar6 != 0) {
      sVar2 = write(WriteFD,__buf,(long)iVar6);
      if ((int)sVar2 < 0) goto LAB_0014ca18;
      uVar1 = (ulong)(uint)(iVar6 - (int)sVar2);
    }
  }
LAB_0014ca18:
  operator_delete__(__buf);
  if ((iVar7 < 1) && (-1 < iVar6)) {
    uVar5 = 0;
    peVar3 = (error_category *)std::_V2::system_category();
  }
  else {
    puVar4 = (uint *)__errno_location();
    uVar5 = *puVar4;
    peVar3 = (error_category *)std::_V2::generic_category();
  }
  eVar8._4_4_ = 0;
  eVar8._M_value = uVar5;
  eVar8._M_cat = peVar3;
  return eVar8;
}

Assistant:

static std::error_code copy_file_internal(int ReadFD, int WriteFD) {
  const size_t BufSize = 4096;
  char *Buf = new char[BufSize];
  int BytesRead = 0, BytesWritten = 0;
  for (;;) {
    BytesRead = read(ReadFD, Buf, BufSize);
    if (BytesRead <= 0)
      break;
    while (BytesRead) {
      BytesWritten = write(WriteFD, Buf, BytesRead);
      if (BytesWritten < 0)
        break;
      BytesRead -= BytesWritten;
    }
    if (BytesWritten < 0)
      break;
  }
  delete[] Buf;

  if (BytesRead < 0 || BytesWritten < 0)
    return std::error_code(errno, std::generic_category());
  return std::error_code();
}